

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanNotBack(UnicodeSetStringSpan *this,UChar *s,int32_t length)

{
  UChar *pUVar1;
  UChar UVar2;
  ushort uVar3;
  uint uVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  void *pvVar8;
  long lVar9;
  int iVar10;
  int32_t length_00;
  int iVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  
  uVar4 = this->strings->count;
  length_00 = length;
  do {
    uVar6 = UnicodeSet::spanBack(this->pSpanNotSet,s,length_00,USET_SPAN_NOT_CONTAINED);
    if (uVar6 == 0) {
      return 0;
    }
    UVar2 = s[(long)(int)uVar6 + -1];
    if ((((int)uVar6 < 2) || (((ushort)UVar2 & 0xfc00) != 0xdc00)) ||
       ((s[(ulong)uVar6 - 2] & 0xfc00U) != 0xd800)) {
      cVar5 = UnicodeSet::contains(&this->spanSet,(uint)(ushort)UVar2);
      iVar10 = -1;
    }
    else {
      cVar5 = UnicodeSet::contains
                        (&this->spanSet,
                         (uint)(ushort)UVar2 + (uint)(ushort)s[(ulong)uVar6 - 2] * 0x400 +
                         -0x35fdc00);
      iVar10 = -2;
    }
    if (cVar5 != '\0') {
      return uVar6;
    }
    if (0 < (int)uVar4) {
      uVar14 = 0;
      do {
        if (this->spanLengths[uVar14] != 0xff) {
          pvVar8 = UVector::elementAt(this->strings,(int32_t)uVar14);
          uVar3 = *(ushort *)((long)pvVar8 + 8);
          if ((uVar3 & 0x11) == 0) {
            if ((uVar3 & 2) == 0) {
              lVar9 = *(long *)((long)pvVar8 + 0x18);
            }
            else {
              lVar9 = (long)pvVar8 + 10;
            }
          }
          else {
            lVar9 = 0;
          }
          if ((short)uVar3 < 0) {
            iVar7 = *(int *)((long)pvVar8 + 0xc);
          }
          else {
            iVar7 = (int)(short)uVar3 >> 5;
          }
          iVar11 = uVar6 - iVar7;
          if (iVar7 <= (int)uVar6) {
            pUVar1 = s + iVar11;
            iVar12 = iVar7 + 1;
            lVar13 = 0;
            do {
              if (*(short *)((long)pUVar1 + lVar13) != *(short *)(lVar9 + lVar13))
              goto LAB_002bf476;
              lVar13 = lVar13 + 2;
              iVar12 = iVar12 + -1;
            } while (1 < iVar12);
            if (((iVar11 < 1) || ((pUVar1[-1] & 0xfc00U) != 0xd800)) ||
               ((*pUVar1 & 0xfc00U) != 0xdc00)) {
              if (length - iVar11 <= iVar7) {
                return uVar6;
              }
              if ((pUVar1[(long)iVar7 + -1] & 0xfc00U) != 0xd800) {
                return uVar6;
              }
              if ((pUVar1[iVar7] & 0xfc00U) != 0xdc00) {
                return uVar6;
              }
            }
          }
        }
LAB_002bf476:
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar4);
    }
    length_00 = iVar10 + uVar6;
    if (length_00 == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int32_t UnicodeSetStringSpan::spanNotBack(const UChar *s, int32_t length) const {
    int32_t pos=length;
    int32_t i, stringsLength=strings.size();
    do {
        // Span until we find a code point from the set,
        // or a code point that starts or ends some string.
        pos=pSpanNotSet->spanBack(s, pos, USET_SPAN_NOT_CONTAINED);
        if(pos==0) {
            return 0;  // Reached the start of the string.
        }

        // Check whether the current code point is in the original set,
        // without the string starts and ends.
        int32_t cpLength=spanOneBack(spanSet, s, pos);
        if(cpLength>0) {
            return pos;  // There is a set element at pos.
        }

        // Try to match the strings at pos.
        for(i=0; i<stringsLength; ++i) {
            // Use spanLengths rather than a spanBackLengths pointer because
            // it is easier and we only need to know whether the string is irrelevant
            // which is the same in either array.
            if(spanLengths[i]==ALL_CP_CONTAINED) {
                continue;  // Irrelevant string.
            }
            const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
            const UChar *s16=string.getBuffer();
            int32_t length16=string.length();
            if(length16<=pos && matches16CPB(s, pos-length16, length, s16, length16)) {
                return pos;  // There is a set element at pos.
            }
        }

        // The span(while not contained) ended on a string start/end which is
        // not in the original set. Skip this code point and continue.
        // cpLength<0
        pos+=cpLength;
    } while(pos!=0);
    return 0;  // Reached the start of the string.
}